

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bounded_utf8_length_sequence.h
# Opt level: O0

uint32_t __thiscall
absl::lts_20240722::debugging_internal::BoundedUtf8LengthSequence<256U>::
InsertAndReturnSumOfPredecessors
          (BoundedUtf8LengthSequence<256U> *this,uint32_t index,uint32_t utf8_length)

{
  unsigned_long x;
  type tVar1;
  ulong x_00;
  sbyte sVar2;
  uint uVar3;
  ulong uVar4;
  uint local_68;
  uint32_t j_1;
  uint32_t sum_of_predecessors;
  uint64_t word_below_insertion;
  int local_50;
  uint32_t j;
  int odd_popcount;
  int full_popcount;
  uint64_t same_word_bits_below_insertion;
  uint64_t higher_seminibbles_mask;
  uint64_t lower_seminibbles_mask;
  uint64_t odd_bits_mask;
  uint64_t ones_bit;
  uint32_t bit_index;
  uint32_t word_index;
  uint32_t utf8_length_local;
  uint32_t index_local;
  BoundedUtf8LengthSequence<256U> *this_local;
  
  word_index = index;
  if (0xff < index) {
    word_index = 0xff;
  }
  if ((utf8_length == 0) || (bit_index = utf8_length, 4 < utf8_length)) {
    bit_index = 1;
  }
  uVar3 = word_index >> 5;
  sVar2 = (sbyte)((word_index & 0x1f) << 1);
  uVar4 = (1L << sVar2) - 1;
  x_00 = this->rep_[uVar3] & uVar4;
  j = popcount<unsigned_long>(x_00);
  local_50 = popcount<unsigned_long>(x_00 & 0xaaaaaaaaaaaaaaaa);
  for (word_below_insertion._4_4_ = uVar3; word_below_insertion._4_4_ != 0;
      word_below_insertion._4_4_ = word_below_insertion._4_4_ - 1) {
    x = this->rep_[word_below_insertion._4_4_ - 1];
    tVar1 = popcount<unsigned_long>(x);
    j = tVar1 + j;
    tVar1 = popcount<unsigned_long>(x & 0xaaaaaaaaaaaaaaaa);
    local_50 = tVar1 + local_50;
  }
  for (local_68 = 7; uVar3 < local_68; local_68 = local_68 - 1) {
    this->rep_[local_68] = this->rep_[local_68] << 2 | this->rep_[local_68 - 1] >> 0x3e;
  }
  this->rep_[uVar3] =
       this->rep_[uVar3] & uVar4 | (ulong)(bit_index - 1) << sVar2 |
       (this->rep_[uVar3] & (uVar4 ^ 0xffffffffffffffff)) << 2;
  return word_index + j + local_50;
}

Assistant:

uint32_t InsertAndReturnSumOfPredecessors(
      uint32_t index, uint32_t utf8_length) {
    // The caller shouldn't pass out-of-bounds inputs, but if it does happen,
    // clamp the values and try to continue.  If we're being called from a
    // signal handler, the last thing we want to do is crash.  Emitting
    // malformed UTF-8 is a lesser evil.
    if (index >= max_elements) index = max_elements - 1;
    if (utf8_length == 0 || utf8_length > 4) utf8_length = 1;

    const uint32_t word_index = index/32;
    const uint32_t bit_index = 2 * (index % 32);
    const uint64_t ones_bit = uint64_t{1} << bit_index;

    // Compute the sum of predecessors.
    //   - Each value from 1 to 4 is represented by a bit field with value from
    //     0 to 3, so the desired sum is index plus the sum of the
    //     representations actually stored.
    //   - For each bit field, a set low bit should contribute 1 to the sum, and
    //     a set high bit should contribute 2.
    //   - Another way to say the same thing is that each set bit contributes 1,
    //     and each set high bit contributes an additional 1.
    //   - So the sum we want is index + popcount(everything) + popcount(bits in
    //     odd positions).
    const uint64_t odd_bits_mask = 0xaaaaaaaaaaaaaaaa;
    const uint64_t lower_seminibbles_mask = ones_bit - 1;
    const uint64_t higher_seminibbles_mask = ~lower_seminibbles_mask;
    const uint64_t same_word_bits_below_insertion =
        rep_[word_index] & lower_seminibbles_mask;
    int full_popcount = absl::popcount(same_word_bits_below_insertion);
    int odd_popcount =
        absl::popcount(same_word_bits_below_insertion & odd_bits_mask);
    for (uint32_t j = word_index; j > 0; --j) {
      const uint64_t word_below_insertion = rep_[j - 1];
      full_popcount += absl::popcount(word_below_insertion);
      odd_popcount += absl::popcount(word_below_insertion & odd_bits_mask);
    }
    const uint32_t sum_of_predecessors =
        index + static_cast<uint32_t>(full_popcount + odd_popcount);

    // Now insert utf8_length's representation, shifting successors up one
    // place.
    for (uint32_t j = max_elements/32 - 1; j > word_index; --j) {
      rep_[j] = (rep_[j] << 2) | (rep_[j - 1] >> 62);
    }
    rep_[word_index] =
        (rep_[word_index] & lower_seminibbles_mask) |
        (uint64_t{utf8_length - 1} << bit_index) |
        ((rep_[word_index] & higher_seminibbles_mask) << 2);

    return sum_of_predecessors;
  }